

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

optional<ChainType> GetNetworkForMagic(MessageStartChars *message)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  ulong uStack_c0;
  undefined1 local_b8 [12];
  MessageStartChars signet_msg;
  undefined1 local_a8 [32];
  undefined1 local_88 [24];
  __node_base local_70;
  size_type sStack_68;
  __node_base local_60;
  size_t sStack_58;
  __node_base_ptr local_50;
  size_t local_48;
  _Hash_node_base _Stack_40;
  bool local_38;
  MessageStartChars regtest_msg;
  MessageStartChars testnet4_msg;
  MessageStartChars testnet_msg;
  MessageStartChars mainnet_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::Main();
  mainnet_msg._M_elems = *(_Type *)&((_Hash_node_base *)(local_a8._0_8_ + 0x170))->_M_nxt;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_a8);
  CChainParams::TestNet();
  testnet_msg._M_elems = *(_Type *)&((_Hash_node_base *)(local_a8._0_8_ + 0x170))->_M_nxt;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_a8);
  CChainParams::TestNet4();
  testnet4_msg._M_elems = *(_Type *)&((_Hash_node_base *)(local_a8._0_8_ + 0x170))->_M_nxt;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_a8);
  local_a8._0_8_ = local_88 + 0x10;
  uStack_c0 = 1;
  local_a8._8_8_ = (pointer)0x1;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_88._0_8_ = (pointer)0x3f800000;
  local_70._M_nxt = &_Stack_40;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  sStack_68 = 1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  sStack_58 = 0;
  local_50 = (__node_base_ptr)0x3f800000;
  local_48 = 0;
  _Stack_40._M_nxt = (_Hash_node_base *)0x0;
  local_38 = false;
  CChainParams::RegTest((RegTestOptions *)local_b8);
  regtest_msg._M_elems = *&((MessageStartChars *)(local_b8._0_8_ + 0x170))->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_b8);
  CChainParams::RegTestOptions::~RegTestOptions((RegTestOptions *)local_a8);
  local_a8._24_8_ = local_a8._24_8_ & 0xffffffffffffff00;
  local_70._M_nxt = local_70._M_nxt & 0xffffffffffffff00;
  CChainParams::SigNet((SigNetOptions *)local_b8);
  uVar3 = 0x100000000;
  signet_msg._M_elems = *&((MessageStartChars *)(local_b8._0_8_ + 0x170))->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_b8);
  CChainParams::SigNetOptions::~SigNetOptions((SigNetOptions *)local_a8);
  bVar2 = std::ranges::__equal_fn::
          operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                    ((__equal_fn *)&std::ranges::equal,message,&mainnet_msg);
  if (bVar2) {
    uStack_c0 = 0;
  }
  else {
    bVar2 = std::ranges::__equal_fn::
            operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,message,&testnet_msg);
    if (!bVar2) {
      bVar2 = std::ranges::__equal_fn::
              operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,message,&testnet4_msg);
      if (bVar2) {
        uStack_c0 = 4;
      }
      else {
        bVar2 = std::ranges::__equal_fn::
                operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                          ((__equal_fn *)&std::ranges::equal,message,&regtest_msg);
        if (bVar2) {
          uStack_c0 = 3;
        }
        else {
          bVar2 = std::ranges::__equal_fn::
                  operator()<const_std::array<unsigned_char,_4UL>_&,_const_std::array<unsigned_char,_4UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                            ((__equal_fn *)&std::ranges::equal,message,&signet_msg);
          if (!bVar2) {
            uVar3 = 0;
          }
          uStack_c0 = 2;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (_Optional_base<ChainType,_true,_true>)
         (_Optional_base<ChainType,_true,_true>)(uVar3 | uStack_c0);
}

Assistant:

std::optional<ChainType> GetNetworkForMagic(const MessageStartChars& message)
{
    const auto mainnet_msg = CChainParams::Main()->MessageStart();
    const auto testnet_msg = CChainParams::TestNet()->MessageStart();
    const auto testnet4_msg = CChainParams::TestNet4()->MessageStart();
    const auto regtest_msg = CChainParams::RegTest({})->MessageStart();
    const auto signet_msg = CChainParams::SigNet({})->MessageStart();

    if (std::ranges::equal(message, mainnet_msg)) {
        return ChainType::MAIN;
    } else if (std::ranges::equal(message, testnet_msg)) {
        return ChainType::TESTNET;
    } else if (std::ranges::equal(message, testnet4_msg)) {
        return ChainType::TESTNET4;
    } else if (std::ranges::equal(message, regtest_msg)) {
        return ChainType::REGTEST;
    } else if (std::ranges::equal(message, signet_msg)) {
        return ChainType::SIGNET;
    }
    return std::nullopt;
}